

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void ma_rbi_to_abi(ma_rbi *rbi,ma_abi *r)

{
  ma_abi *r_local;
  ma_rbi *rbi_local;
  
  if (rbi == (ma_rbi *)0x0) {
    __assert_fail("rbi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x164,"void ma_rbi_to_abi(const struct ma_rbi *, struct ma_abi *)");
  }
  if (r != (ma_abi *)0x0) {
    r->body = rbi->body;
    r->point = rbi->point;
    r->frame = rbi->frame;
    return;
  }
  __assert_fail("r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x165,"void ma_rbi_to_abi(const struct ma_rbi *, struct ma_abi *)");
}

Assistant:

void ma_rbi_to_abi(
        const struct ma_rbi *rbi,
        struct ma_abi *r)
{
    assert(rbi);
    assert(r);

    r->body = rbi->body;
    r->point = rbi->point;
    r->frame = rbi->frame;
}